

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_cfg.cpp
# Opt level: O0

void __thiscall MppDecCfgService::MppDecCfgService(MppDecCfgService *this)

{
  MPP_RET MVar1;
  RK_S32 RVar2;
  undefined8 local_21c;
  MppCfgInfo tmp_25;
  MppCfgInfo tmp_24;
  MppCfgInfo tmp_23;
  MppCfgInfo tmp_22;
  MppCfgInfo tmp_21;
  MppCfgInfo tmp_20;
  MppCfgInfo tmp_19;
  MppCfgInfo tmp_18;
  MppCfgInfo tmp_17;
  MppCfgInfo tmp_16;
  MppCfgInfo tmp_15;
  MppCfgInfo tmp_14;
  MppCfgInfo tmp_13;
  MppCfgInfo tmp_12;
  MppCfgInfo tmp_11;
  MppCfgInfo tmp_10;
  MppCfgInfo tmp_9;
  MppCfgInfo tmp_8;
  MppCfgInfo tmp_7;
  MppCfgInfo tmp_6;
  MppCfgInfo tmp_5;
  MppCfgInfo tmp_4;
  MppCfgInfo tmp_3;
  MppCfgInfo tmp_2;
  MppCfgInfo tmp_1;
  MppCfgInfo tmp;
  MPP_RET ret;
  MppDecCfgService *this_local;
  
  this->mTrie = (MppTrie)0x0;
  MVar1 = mpp_trie_init(&this->mTrie,"MppDecCfg");
  if (MVar1 == MPP_OK) {
    tmp_1.data_offset = 1;
    tmp_1.data_size = 0;
    mpp_trie_add_info(this->mTrie,"base:type",&tmp_1.data_offset,0x14);
    tmp_2.data_offset = 1;
    tmp_2.data_size = 0;
    tmp_1.data_type = CFG_FUNC_TYPE_S64;
    tmp_1.flag_offset = 0xc;
    tmp_1.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:coding",&tmp_2.data_offset,0x14);
    tmp_3.data_offset = 1;
    tmp_3.data_size = 0;
    tmp_2.data_type = CFG_FUNC_TYPE_St;
    tmp_2.flag_offset = 0x10;
    tmp_2.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:hw_type",&tmp_3.data_offset,0x14);
    tmp_4.data_offset = 1;
    tmp_4.data_size = 0;
    tmp_3.data_type = 8;
    tmp_3.flag_offset = 0x14;
    tmp_3.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:batch_mode",&tmp_4.data_offset,0x14);
    tmp_5.data_offset = 1;
    tmp_5.data_size = 0;
    tmp_4.data_type = 0x100;
    tmp_4.flag_offset = 0x18;
    tmp_4.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:out_fmt",&tmp_5.data_offset,0x14);
    tmp_6.data_offset = 1;
    tmp_6.data_size = 0;
    tmp_5.data_type = 0x200;
    tmp_5.flag_offset = 0x1c;
    tmp_5.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:fast_out",&tmp_6.data_offset,0x14);
    tmp_7.data_offset = 1;
    tmp_7.data_size = 0;
    tmp_6.data_type = 0x400;
    tmp_6.flag_offset = 0x20;
    tmp_6.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:fast_parse",&tmp_7.data_offset,0x14);
    tmp_8.data_offset = 1;
    tmp_8.data_size = 0;
    tmp_7.data_type = 0x800;
    tmp_7.flag_offset = 0x24;
    tmp_7.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:split_parse",&tmp_8.data_offset,0x14);
    tmp_9.data_offset = 1;
    tmp_9.data_size = 0;
    tmp_8.data_type = 0x1000;
    tmp_8.flag_offset = 0x28;
    tmp_8.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:internal_pts",&tmp_9.data_offset,0x14);
    tmp_10.data_offset = 1;
    tmp_10.data_size = 0;
    tmp_9.data_type = 0x2000;
    tmp_9.flag_offset = 0x2c;
    tmp_9.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:sort_pts",&tmp_10.data_offset,0x14);
    tmp_11.data_offset = 1;
    tmp_11.data_size = 0;
    tmp_10.data_type = 0x4000;
    tmp_10.flag_offset = 0x30;
    tmp_10.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:disable_error",&tmp_11.data_offset,0x14);
    tmp_12.data_offset = 1;
    tmp_12.data_size = 0;
    tmp_11.data_type = 0x8000;
    tmp_11.flag_offset = 0x34;
    tmp_11.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:enable_vproc",&tmp_12.data_offset,0x14);
    tmp_13.data_offset = 1;
    tmp_13.data_size = 0;
    tmp_12.data_type = 0x10000;
    tmp_12.flag_offset = 0x38;
    tmp_12.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:enable_fast_play",&tmp_13.data_offset,0x14);
    tmp_14.data_offset = 1;
    tmp_14.data_size = 0;
    tmp_13.data_type = 0x20000;
    tmp_13.flag_offset = 0x3c;
    tmp_13.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:enable_hdr_meta",&tmp_14.data_offset,0x14);
    tmp_15.data_offset = 1;
    tmp_15.data_size = 0;
    tmp_14.data_type = 0x40000;
    tmp_14.flag_offset = 0x40;
    tmp_14.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:enable_thumbnail",&tmp_15.data_offset,0x14);
    tmp_16.data_offset = 1;
    tmp_16.data_size = 0;
    tmp_15.data_type = 0x80000;
    tmp_15.flag_offset = 0x44;
    tmp_15.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:enable_mvc",&tmp_16.data_offset,0x14);
    tmp_17.data_offset = 1;
    tmp_17.data_size = 0;
    tmp_16.data_type = 0x100000;
    tmp_16.flag_offset = 0x48;
    tmp_16.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:disable_dpb_chk",&tmp_17.data_offset,0x14);
    tmp_18.data_offset = 1;
    tmp_18.data_size = 0;
    tmp_17.data_type = 0x10000000;
    tmp_17.flag_offset = 0x4c;
    tmp_17.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:disable_thread",&tmp_18.data_offset,0x14);
    tmp_19.data_offset = 1;
    tmp_19.data_size = 0;
    tmp_18.data_type = 0x20000000;
    tmp_18.flag_offset = 0x50;
    tmp_18.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:codec_mode",&tmp_19.data_offset,0x14);
    tmp_20.data_offset = 1;
    tmp_20.data_size = 0;
    tmp_19.data_type = 0x40000000;
    tmp_19.flag_offset = 0x54;
    tmp_19.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"base:dis_err_clr_mark",&tmp_20.data_offset,0x14);
    tmp_21.data_offset = 5;
    tmp_21.data_size = 0x68;
    tmp_20.data_type = CFG_FUNC_TYPE_U32;
    tmp_20.flag_offset = 0x70;
    tmp_20.flag_value = 8;
    mpp_trie_add_info(this->mTrie,"cb:pkt_rdy_cb",&tmp_21.data_offset,0x14);
    tmp_22.data_offset = 5;
    tmp_22.data_size = 0x68;
    tmp_21.data_type = CFG_FUNC_TYPE_U32;
    tmp_21.flag_offset = 0x78;
    tmp_21.flag_value = 8;
    mpp_trie_add_info(this->mTrie,"cb:pkt_rdy_ctx",&tmp_22.data_offset,0x14);
    tmp_23.data_offset = 0;
    tmp_23.data_size = 0x68;
    tmp_22.data_type = CFG_FUNC_TYPE_U32;
    tmp_22.flag_offset = 0x80;
    tmp_22.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"cb:pkt_rdy_cmd",&tmp_23.data_offset,0x14);
    tmp_24.data_offset = 5;
    tmp_24.data_size = 0x68;
    tmp_23.data_type = CFG_FUNC_TYPE_S64;
    tmp_23.flag_offset = 0x88;
    tmp_23.flag_value = 8;
    mpp_trie_add_info(this->mTrie,"cb:frm_rdy_cb",&tmp_24.data_offset,0x14);
    tmp_25.data_offset = 5;
    tmp_25.data_size = 0x68;
    tmp_24.data_type = CFG_FUNC_TYPE_S64;
    tmp_24.flag_offset = 0x90;
    tmp_24.flag_value = 8;
    mpp_trie_add_info(this->mTrie,"cb:frm_rdy_ctx",&tmp_25.data_offset,0x14);
    local_21c = 0x6800000000;
    tmp_25.data_type = CFG_FUNC_TYPE_S64;
    tmp_25.flag_offset = 0x98;
    tmp_25.flag_value = 4;
    mpp_trie_add_info(this->mTrie,"cb:frm_rdy_cmd",&local_21c,0x14);
    mpp_trie_add_info(this->mTrie,(char *)0x0,(void *)0x0,0);
    RVar2 = mpp_trie_get_node_count(this->mTrie);
    (this->mHead).node_count = RVar2;
    RVar2 = mpp_trie_get_info_count(this->mTrie);
    (this->mHead).info_count = RVar2;
    RVar2 = mpp_trie_get_buf_size(this->mTrie);
    (this->mHead).info_size = RVar2;
    if ((mpp_dec_cfg_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec_cfg","node cnt: %d\n","MppDecCfgService",
                 (ulong)(uint)(this->mHead).node_count);
    }
  }
  else {
    _mpp_log_l(2,"mpp_dec_cfg","failed to init dec cfg set trie\n","MppDecCfgService");
  }
  return;
}

Assistant:

MppDecCfgService::MppDecCfgService() :
    mTrie(NULL)
{
    MPP_RET ret = mpp_trie_init(&mTrie, "MppDecCfg");
    if (ret) {
        mpp_err_f("failed to init dec cfg set trie\n");
        return ;
    }

    ENTRY_TABLE(EXPAND_AS_TRIE)

    mpp_trie_add_info(mTrie, NULL, NULL, 0);

    mHead.node_count = mpp_trie_get_node_count(mTrie);
    mHead.info_count = mpp_trie_get_info_count(mTrie);
    mHead.info_size = mpp_trie_get_buf_size(mTrie);

    mpp_dec_cfg_dbg_func("node cnt: %d\n", mHead.node_count);
}